

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqlite_context_random_string(unqlite_context *pCtx,char *zBuf,int nBuflen)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = -0x18;
  if (2 < nBuflen) {
    SyRandomness(&pCtx->pVm->sPrng,zBuf,nBuflen);
    iVar1 = 0;
    uVar2 = 0;
    do {
      zBuf[uVar2] = "abcdefghijklmnopqrstuvwxyz"[(ulong)(long)zBuf[uVar2] % 0x1a];
      uVar2 = uVar2 + 1;
    } while ((uint)nBuflen != uVar2);
  }
  return iVar1;
}

Assistant:

int unqlite_context_random_string(unqlite_context *pCtx, char *zBuf, int nBuflen)
{
	return jx9_context_random_string(pCtx,zBuf,nBuflen);
}